

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O0

void fl_frame(char *s,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  char *pcVar4;
  uchar *g;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  char *s_local;
  
  puVar3 = fl_gray_ramp();
  if ((0 < h) && (g._0_4_ = h, g._4_4_ = w, h_local = y, w_local = x, _y_local = s, 0 < w)) {
    do {
      if (*_y_local == '\0') {
        return;
      }
      fl_color((uint)puVar3[(int)*_y_local]);
      fl_xyline(w_local,h_local,w_local + g._4_4_ + -1);
      h_local = h_local + 1;
      iVar1 = (int)g + -1;
      if (iVar1 < 1) {
        return;
      }
      fl_color((uint)puVar3[(int)_y_local[1]]);
      fl_yxline(w_local,h_local + iVar1 + -1,h_local);
      w_local = w_local + 1;
      iVar2 = g._4_4_ + -1;
      if (iVar2 < 1) {
        return;
      }
      pcVar4 = _y_local + 3;
      fl_color((uint)puVar3[(int)_y_local[2]]);
      fl_xyline(w_local,h_local + iVar1 + -1,w_local + iVar2 + -1);
      g._0_4_ = (int)g + -2;
      if ((int)g < 1) {
        return;
      }
      _y_local = _y_local + 4;
      fl_color((uint)puVar3[(int)*pcVar4]);
      fl_yxline(w_local + iVar2 + -1,h_local + (int)g + -1,h_local);
      g._4_4_ = g._4_4_ + -2;
    } while (0 < g._4_4_);
  }
  return;
}

Assistant:

void fl_frame(const char* s, int x, int y, int w, int h) {
  const uchar *g = fl_gray_ramp();
  if (h > 0 && w > 0) for (;*s;) {
    // draw top line:
    fl_color(g[(int)*s++]);
    fl_xyline(x, y, x+w-1);
    y++; if (--h <= 0) break;
    // draw left line:
    fl_color(g[(int)*s++]);
    fl_yxline(x, y+h-1, y);
    x++; if (--w <= 0) break;
    // draw bottom line:
    fl_color(g[(int)*s++]);
    fl_xyline(x, y+h-1, x+w-1);
    if (--h <= 0) break;
    // draw right line:
    fl_color(g[(int)*s++]);
    fl_yxline(x+w-1, y+h-1, y);
    if (--w <= 0) break;
  }
}